

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_NodeRef_rec(Gia_Man_t *p,Gia_Obj_t *pNode,int fMark)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar4 = (uint)*(undefined8 *)pNode;
  if ((~uVar4 & 0x9fffffff) == 0) {
    return 0;
  }
  if (((int)uVar4 < 0) || (uVar4 = uVar4 & 0x1fffffff, uVar4 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x456,"int Gia_NodeRef_rec(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  pGVar3 = p->pObjs;
  if (fMark != 0) {
    if ((pNode < pGVar3) || (pGVar3 + p->nObjs <= pNode)) goto LAB_0024176a;
    iVar5 = (int)((long)pNode - (long)pGVar3 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar5) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    p->pTravIds[iVar5] = p->nTravIds;
    uVar4 = (uint)*(undefined8 *)pNode & 0x1fffffff;
  }
  pGVar1 = pNode + -(ulong)uVar4;
  if ((pGVar3 <= pGVar1) && (pGVar1 < pGVar3 + p->nObjs)) {
    iVar6 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555;
    iVar5 = p->pRefs[iVar6];
    p->pRefs[iVar6] = iVar5 + 1;
    iVar6 = 0;
    if (iVar5 == 0) {
      iVar6 = Gia_NodeRef_rec(p,pGVar1,fMark);
      pGVar3 = p->pObjs;
    }
    pGVar1 = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
    if ((pGVar3 <= pGVar1) && (pGVar1 < pGVar3 + p->nObjs)) {
      iVar2 = (int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555;
      iVar5 = p->pRefs[iVar2];
      p->pRefs[iVar2] = iVar5 + 1;
      if (iVar5 == 0) {
        iVar5 = Gia_NodeRef_rec(p,pGVar1,fMark);
        iVar6 = iVar6 + iVar5;
      }
      return iVar6 + 1;
    }
  }
LAB_0024176a:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_NodeRef_rec( Gia_Man_t * p, Gia_Obj_t * pNode, int fMark )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    if ( fMark ) Gia_ObjSetTravIdCurrent(p, pNode);
    pFanin = Gia_ObjFanin0(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    pFanin = Gia_ObjFanin1(pNode);
    if ( Gia_ObjRefInc(p, pFanin) == 0 )
        Counter += Gia_NodeRef_rec( p, pFanin, fMark );
    return Counter + 1;
}